

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O0

void __thiscall
jrtplib::RTPExternalTransmitter::DeleteTransmissionInfo
          (RTPExternalTransmitter *this,RTPTransmissionInfo *i)

{
  RTPMemoryManager *mgr;
  RTPTransmissionInfo *i_local;
  RTPExternalTransmitter *this_local;
  
  if ((this->init & 1U) != 0) {
    mgr = RTPMemoryObject::GetMemoryManager((RTPMemoryObject *)this);
    RTPDelete<jrtplib::RTPTransmissionInfo>(i,mgr);
  }
  return;
}

Assistant:

void RTPExternalTransmitter::DeleteTransmissionInfo(RTPTransmissionInfo *i)
{
	if (!init)
		return;

	RTPDelete(i, GetMemoryManager());
}